

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ParseContext::
ParseGroup<google::protobuf::internal::UnknownFieldLiteParserHelper>
          (ParseContext *this,UnknownFieldLiteParserHelper *msg,char *ptr,uint32_t tag)

{
  int iVar1;
  uint32_t uVar2;
  char *pcVar3;
  char *pcVar4;
  
  iVar1 = this->depth_;
  this->depth_ = iVar1 + -1;
  if (iVar1 < 1) {
    pcVar4 = (char *)0x0;
  }
  else {
    this->group_depth_ = this->group_depth_ + 1;
    pcVar3 = WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                       (msg,ptr,this);
    this->group_depth_ = this->group_depth_ + -1;
    this->depth_ = this->depth_ + 1;
    uVar2 = (this->super_EpsCopyInputStream).last_tag_minus_1_;
    (this->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    pcVar4 = (char *)0x0;
    if (uVar2 == tag) {
      pcVar4 = pcVar3;
    }
  }
  return pcVar4;
}

Assistant:

PROTOBUF_NODISCARD PROTOBUF_NDEBUG_INLINE const char* ParseGroup(
      T* msg, const char* ptr, uint32_t tag) {
    if (--depth_ < 0) return nullptr;
    group_depth_++;
    ptr = msg->_InternalParse(ptr, this);
    group_depth_--;
    depth_++;
    if (PROTOBUF_PREDICT_FALSE(!ConsumeEndGroup(tag))) return nullptr;
    return ptr;
  }